

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O1

json __thiscall Population::toJson_abi_cxx11_(Population *this)

{
  type_data_t tVar1;
  json_value jVar2;
  type_data_t *ptVar3;
  json_value extraout_RDX;
  ulong *in_RSI;
  json jVar4;
  type_data_t local_48 [4];
  json_value local_40;
  type_data_t local_38 [4];
  json_value local_30;
  type_data_t local_28 [4];
  json_value local_20;
  
  *(undefined2 *)&this->minFitness = 0;
  this->maxFitness = 0.0;
  local_20 = (json_value)*in_RSI;
  local_28[0].data = 7;
  if (0x7fefffffffffffff < (local_20.number_unsigned & 0x7fffffffffffffff)) {
    local_28[0].data = 0;
    local_20.object = (object_t *)0x0;
  }
  ptVar3 = &nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
                        *)this,"minFitness")->m_type;
  tVar1.bits = *(anon_struct_2_6_e09b849c_for_bits *)ptVar3;
  ptVar3->data = (uint16_t)local_28[0];
  jVar2 = *(json_value *)(ptVar3 + 4);
  *(json_value *)(ptVar3 + 4) = (number_unsigned_t)local_20;
  local_28[0].bits = tVar1.bits;
  local_20 = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                 *)&local_28[0].bits);
  local_30 = (json_value)in_RSI[1];
  local_38[0].data = 7;
  if (0x7fefffffffffffff < (local_30.number_unsigned & 0x7fffffffffffffff)) {
    local_38[0].data = 0;
    local_30.object = (object_t *)0x0;
  }
  ptVar3 = &nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
                        *)this,"maxFitness")->m_type;
  tVar1.bits = *(anon_struct_2_6_e09b849c_for_bits *)ptVar3;
  ptVar3->data = (uint16_t)local_38[0];
  jVar2 = *(json_value *)(ptVar3 + 4);
  *(json_value *)(ptVar3 + 4) = (number_unsigned_t)local_30;
  local_38[0].bits = tVar1.bits;
  local_30 = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                 *)&local_38[0].bits);
  local_40 = (json_value)in_RSI[2];
  local_48[0].data = 7;
  if (0x7fefffffffffffff < (local_40.number_unsigned & 0x7fffffffffffffff)) {
    local_48[0].data = 0;
    local_40.object = (object_t *)0x0;
  }
  ptVar3 = &nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
                        *)this,"averageFitness")->m_type;
  tVar1.bits = *(anon_struct_2_6_e09b849c_for_bits *)ptVar3;
  ptVar3->data = (uint16_t)local_48[0];
  jVar2 = *(json_value *)(ptVar3 + 4);
  *(json_value *)(ptVar3 + 4) = (number_unsigned_t)local_40;
  local_48[0].bits = tVar1.bits;
  local_40 = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                 *)&local_48[0].bits);
  jVar4.m_value.object = extraout_RDX.object;
  jVar4._0_8_ = this;
  return jVar4;
}

Assistant:

json Population::toJson() {
    json j;
    j["minFitness"] = minFitness;
    j["maxFitness"] = maxFitness;
    j["averageFitness"] = averageFitness;
    return j;
}